

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O1

bool __thiscall
libtorrent::udp_tracker_connection::on_connect_response
          (udp_tracker_connection *this,span<const_char> buf)

{
  session_settings *psVar1;
  int iVar2;
  long lVar3;
  mapped_type *pmVar4;
  time_point tVar5;
  long ret;
  ulong uVar6;
  key_type local_48;
  
  if (0xf < buf.m_len) {
    timeout_handler::restart_read_timeout((timeout_handler *)this);
    update_transaction_id(this);
    uVar6 = 0;
    lVar3 = 0;
    do {
      uVar6 = uVar6 << 8 | (ulong)(byte)buf.m_ptr[lVar3 + 8];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)m_cache_mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if ((this->m_target).impl_.data_.base.sa_family == 2) {
      local_48._0_8_ = (ulong)(this->m_target).impl_.data_.v6.sin6_flowinfo << 0x20;
      local_48.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_48.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_48.ipv6_address_.scope_id_ = 0;
    }
    else {
      local_48.ipv6_address_.addr_.__in6_u._0_8_ =
           *(ulong *)((long)&(this->m_target).impl_.data_ + 8);
      local_48.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(this->m_target).impl_.data_ + 0x10);
      local_48.ipv6_address_.scope_id_ =
           (unsigned_long)(this->m_target).impl_.data_.v6.sin6_scope_id;
      local_48.type_ = ipv6;
      local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    }
    pmVar4 = std::
             map<boost::asio::ip::address,_libtorrent::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::udp_tracker_connection::connection_cache_entry>_>_>
             ::operator[]((map<boost::asio::ip::address,_libtorrent::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::udp_tracker_connection::connection_cache_entry>_>_>
                           *)m_connection_cache,&local_48);
    pmVar4->connection_id = uVar6;
    tVar5 = aux::time_now();
    psVar1 = ((this->super_tracker_connection).m_man)->m_settings;
    local_48._0_8_ = &psVar1->m_mutex;
    local_48.ipv6_address_.addr_.__in6_u._0_8_ =
         local_48.ipv6_address_.addr_.__in6_u._0_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_48);
    local_48.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = 1;
    iVar2 = (psVar1->m_store).m_ints._M_elems[0x45];
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_48);
    (pmVar4->expires).__d.__r = (long)iVar2 * 1000000000 + (long)tVar5.__d.__r;
    if (((this->super_tracker_connection).m_req.kind & 1) == 0) {
      send_udp_announce(this);
    }
    else {
      send_udp_scrape(this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)m_cache_mutex);
  }
  return 0xf < buf.m_len;
}

Assistant:

bool udp_tracker_connection::on_connect_response(span<char const> buf)
	{
		// ignore packets smaller than 16 bytes
		if (buf.size() < 16) return false;

		restart_read_timeout();

		// skip header
		buf = buf.subspan(8);

		// reset transaction
		update_transaction_id();
		std::int64_t const connection_id = aux::read_int64(buf);

		std::lock_guard<std::mutex> l(m_cache_mutex);
		connection_cache_entry& cce = m_connection_cache[m_target.address()];
		cce.connection_id = connection_id;
		cce.expires = aux::time_now() + seconds(m_man.settings().get_int(settings_pack::udp_tracker_token_expiry));

		if (0 == (tracker_req().kind & tracker_request::scrape_request))
			send_udp_announce();
		else if (0 != (tracker_req().kind & tracker_request::scrape_request))
			send_udp_scrape();
		return true;
	}